

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strnlen_s.c
# Opt level: O3

rsize_t strnlen_s(char *dest,rsize_t dmax)

{
  rsize_t rVar1;
  rsize_t rVar2;
  errno_t error;
  char *msg;
  bool bVar3;
  
  if (dest != (char *)0x0) {
    if (dmax == 0) {
      msg = "strnlen_s: dmax is 0";
      error = 0x191;
    }
    else {
      if (dmax < 0x1001) {
        if (*dest == '\0') {
          return 0;
        }
        rVar2 = 0;
        do {
          rVar1 = rVar2 + 1;
          if (dest[rVar2 + 1] == '\0') {
            return rVar1;
          }
          bVar3 = dmax - 1 != rVar2;
          rVar2 = rVar1;
        } while (bVar3);
        return rVar1;
      }
      msg = "strnlen_s: dmax exceeds max";
      error = 0x193;
    }
    invoke_safe_str_constraint_handler(msg,(void *)0x0,error);
  }
  return 0;
}

Assistant:

rsize_t
strnlen_s (const char *dest, rsize_t dmax)
{
    rsize_t count;

    if (dest == NULL) {
        return RCNEGATE(0);
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("strnlen_s: dmax is 0",
                   NULL, ESZEROL);
        return RCNEGATE(0);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strnlen_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return RCNEGATE(0);
    }

    count = 0;
    while (*dest && dmax) {
        count++;
        dmax--;
        dest++;
    }

    return RCNEGATE(count);
}